

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O0

Amap_Item_t * Amap_LibertyCellOutput(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Amap_Item_t *pAVar2;
  Amap_Item_t *local_28;
  Amap_Item_t *pPin;
  Amap_Item_t *pCell_local;
  Amap_Tree_t *p_local;
  
  local_28 = Amap_LibertyItem(p,pCell->Child);
  while( true ) {
    if (local_28 == (Amap_Item_t *)0x0) {
      return (Amap_Item_t *)0x0;
    }
    iVar1 = Amap_LibertyCompare(p,local_28->Key,"pin");
    if ((iVar1 == 0) && (pAVar2 = Amap_LibertyPinFunction(p,local_28), pAVar2 != (Amap_Item_t *)0x0)
       ) break;
    local_28 = Amap_LibertyItem(p,local_28->Next);
  }
  return local_28;
}

Assistant:

Amap_Item_t * Amap_LibertyCellOutput( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            return pPin;
    }
    return NULL;
}